

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UBool ucnv_isFixedWidth_63(UConverter *cnv,UErrorCode *status)

{
  UBool UVar1;
  UConverterType UVar2;
  UErrorCode *status_local;
  UConverter *cnv_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (cnv == (UConverter *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      cnv_local._7_1_ = '\0';
    }
    else {
      UVar2 = ucnv_getType_63(cnv);
      if (((((uint)UVar2 < 2) || ((uint)(UVar2 + ~UCNV_UTF16_LittleEndian) < 2)) ||
          (UVar2 == UCNV_US_ASCII)) || (UVar2 == UCNV_UTF32)) {
        cnv_local._7_1_ = '\x01';
      }
      else {
        cnv_local._7_1_ = '\0';
      }
    }
  }
  else {
    cnv_local._7_1_ = '\0';
  }
  return cnv_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucnv_isFixedWidth(UConverter *cnv, UErrorCode *status){
    if (U_FAILURE(*status)) {
        return FALSE;
    }

    if (cnv == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    }

    switch (ucnv_getType(cnv)) {
        case UCNV_SBCS:
        case UCNV_DBCS:
        case UCNV_UTF32_BigEndian:
        case UCNV_UTF32_LittleEndian:
        case UCNV_UTF32:
        case UCNV_US_ASCII:
            return TRUE;
        default:
            return FALSE;
    }
}